

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O3

void __thiscall
chrono::ChIntegrableIIorder::StateScatter
          (ChIntegrableIIorder *this,ChState *y,double T,bool full_update)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ChStateDelta mv;
  ChState mx;
  double *local_88;
  long local_80;
  ChState *local_70;
  long local_68;
  long local_58;
  ChStateDelta local_50;
  ChState local_38;
  
  iVar3 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])();
  ChState::ChState(&local_38,(long)iVar3,y->integrable);
  iVar3 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_50,(long)iVar3,y->integrable);
  iVar3 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
  local_88 = (y->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  lVar1 = (y->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_80 = (long)iVar3;
  if (-1 < iVar3 || local_88 == (double *)0x0) {
    local_68 = 0;
    local_58 = lVar1;
    if ((-1 < iVar3) && (local_80 <= lVar1)) {
      local_70 = y;
      ChState::operator=(&local_38,
                         (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_88);
      uVar4 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
      uVar5 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
      pdVar2 = (y->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      lVar1 = (y->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar6 = (long)(int)uVar4;
      local_80 = (long)(int)uVar5;
      local_88 = pdVar2 + lVar6;
      if ((int)uVar5 < 0 && pdVar2 != (double *)0x0) goto LAB_0086eee8;
      local_68 = lVar6;
      local_58 = lVar1;
      if ((-1 < (int)(uVar5 | uVar4)) && (lVar6 <= lVar1 - local_80)) {
        local_70 = y;
        ChStateDelta::operator=
                  (&local_50,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_88);
        (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x17])
                  (T,this,&local_38,&local_50,full_update);
        if (local_50.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
            (double *)0x0) {
          free((void *)local_50.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[-1]);
        }
        if (local_38.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
            (double *)0x0) {
          free((void *)local_38.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[-1]);
        }
        return;
      }
    }
    local_70 = y;
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
LAB_0086eee8:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChIntegrableIIorder::StateScatter(const ChState& y, const double T, bool full_update) {
    ChState mx(GetNcoords_x(), y.GetIntegrable());
    ChStateDelta mv(GetNcoords_v(), y.GetIntegrable());
    mx = y.segment(0, GetNcoords_x());
    mv = y.segment(GetNcoords_x(), GetNcoords_v());
    StateScatter(mx, mv, T, full_update);
}